

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BayesianProbitRegressor_FeatureValueWeight *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
          (Arena *arena)

{
  BayesianProbitRegressor_FeatureValueWeight *this;
  
  if (arena == (Arena *)0x0) {
    this = (BayesianProbitRegressor_FeatureValueWeight *)operator_new(0x20);
    CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
    BayesianProbitRegressor_FeatureValueWeight(this,(Arena *)0x0,false);
  }
  else {
    this = (BayesianProbitRegressor_FeatureValueWeight *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)
                      &CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::typeinfo);
    CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
    BayesianProbitRegressor_FeatureValueWeight(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }